

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_print.c
# Opt level: O0

void srunner_fprint(FILE *file,SRunner *sr,print_output print_mode)

{
  undefined4 local_1c;
  print_output print_mode_local;
  SRunner *sr_local;
  FILE *file_local;
  
  local_1c = print_mode;
  if (print_mode == CK_ENV) {
    local_1c = get_env_printmode();
  }
  srunner_fprint_summary(file,sr,local_1c);
  srunner_fprint_results(file,sr,local_1c);
  return;
}

Assistant:

void srunner_fprint(FILE * file, SRunner * sr, enum print_output print_mode)
{
    if(print_mode == CK_ENV)
    {
        print_mode = get_env_printmode();
    }

    srunner_fprint_summary(file, sr, print_mode);
    srunner_fprint_results(file, sr, print_mode);
}